

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O0

ByteMark * __thiscall DataBuffer::addMark(DataBuffer *this,String *name)

{
  int iVar1;
  ByteMark *this_00;
  ByteMark *local_20;
  ByteMark *mark;
  String *name_local;
  DataBuffer *this_local;
  
  mark = (ByteMark *)name;
  name_local = (String *)this;
  this_00 = (ByteMark *)operator_new(0x28);
  ByteMark::ByteMark(this_00);
  local_20 = this_00;
  String::operator=((String *)this_00,&mark->name);
  iVar1 = writtenSize(this);
  local_20->pos = iVar1;
  List<ByteMark_*>::operator<<(&this->m_marks,&local_20);
  return local_20;
}

Assistant:

ByteMark* DataBuffer::addMark (const String& name)
{
	ByteMark* mark = new ByteMark;
	mark->name = name;
	mark->pos = writtenSize();
	m_marks << mark;
	return mark;
}